

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

void __thiscall QOpenGLTexture::setLevelofDetailBias(QOpenGLTexture *this,float bias)

{
  long lVar1;
  ulong uVar2;
  QOpenGLTexturePrivate *pQVar3;
  QOpenGLTexturePrivate *in_RDI;
  long in_FS_OFFSET;
  GLfloat in_XMM0_Da;
  QOpenGLTexturePrivate *d;
  undefined8 in_stack_ffffffffffffffc0;
  int line;
  undefined4 in_stack_ffffffffffffffc8;
  QOpenGLTexturePrivate *this_00;
  GLenum in_stack_ffffffffffffffd8;
  GLuint in_stack_ffffffffffffffdc;
  QOpenGLTextureHelper *in_stack_ffffffffffffffe0;
  
  line = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QOpenGLContext::currentContext();
  uVar2 = QOpenGLContext::isOpenGLES();
  if ((uVar2 & 1) == 0) {
    pQVar3 = d_func((QOpenGLTexture *)0x190a44);
    QOpenGLTexturePrivate::create(this_00);
    pQVar3->levelOfDetailBias = in_XMM0_Da;
    QOpenGLTextureHelper::glTextureParameterf
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
               (GLenum)((ulong)this_00 >> 0x20),(GLenum)this_00,in_XMM0_Da);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8),line
               ,(char *)in_RDI);
    QMessageLogger::warning
              (&stack0xffffffffffffffd8,"QOpenGLTexture: Detail level is not supported");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTexture::setLevelofDetailBias(float bias)
{
#if !QT_CONFIG(opengles2)
    if (!QOpenGLContext::currentContext()->isOpenGLES()) {
        Q_D(QOpenGLTexture);
        d->create();
        Q_ASSERT(d->texFuncs);
        Q_ASSERT(d->textureId);
        d->levelOfDetailBias = bias;
        d->texFuncs->glTextureParameterf(d->textureId, d->target, d->bindingTarget, GL_TEXTURE_LOD_BIAS, bias);
        return;
    }
#else
    Q_UNUSED(bias);
#endif
    qWarning("QOpenGLTexture: Detail level is not supported");
}